

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_write_record(mbedtls_ssl_context *ssl)

{
  size_t sVar1;
  uint *puVar2;
  ushort uVar3;
  uint uVar4;
  mbedtls_ssl_handshake_params *pmVar5;
  mbedtls_ssl_flight_item *pmVar6;
  mbedtls_ssl_transform *pmVar7;
  mbedtls_cipher_info_t *pmVar8;
  size_t ilen;
  size_t iv_len;
  ulong uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  mbedtls_ssl_flight_item *__ptr;
  uchar *puVar13;
  mbedtls_ssl_flight_item *pmVar14;
  long lVar15;
  uchar uVar16;
  ulong uVar17;
  long lVar18;
  mbedtls_cipher_mode_t mVar19;
  int iVar20;
  size_t sVar21;
  bool bVar22;
  size_t olen_1;
  size_t local_70;
  uchar mac [48];
  
  sVar21 = ssl->out_msglen;
  if (((((ssl->conf->field_0x174 & 2) == 0) ||
       (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0)) ||
      (ssl->handshake->retransmit_state != '\x01')) && (ssl->out_msgtype == 0x16)) {
    uVar16 = *ssl->out_msg;
    if ((uVar16 != '\0') && (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0)) {
      return -0x6c00;
    }
    sVar1 = sVar21 - 4;
    ssl->out_msg[1] = (uchar)(sVar1 >> 0x10);
    ssl->out_msg[2] = (uchar)(sVar1 >> 8);
    ssl->out_msg[3] = (uchar)sVar1;
    if ((ssl->conf->field_0x174 & 2) != 0) {
      if (ssl->out_msglen - 0x3ff9 < 8) {
        return -0x7100;
      }
      memmove(ssl->out_msg + 0xc,ssl->out_msg + 4,sVar1);
      ssl->out_msglen = ssl->out_msglen + 8;
      if (uVar16 == '\0') {
        ssl->out_msg[4] = '\0';
        ssl->out_msg[5] = '\0';
      }
      else {
        ssl->out_msg[4] = *(uchar *)((long)&ssl->handshake->out_msg_seq + 1);
        ssl->out_msg[5] = (uchar)ssl->handshake->out_msg_seq;
        puVar2 = &ssl->handshake->out_msg_seq;
        *puVar2 = *puVar2 + 1;
      }
      sVar21 = sVar21 + 8;
      puVar13 = ssl->out_msg;
      puVar13[8] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      puVar13 = ssl->out_msg;
      puVar13[0xb] = puVar13[3];
      *(undefined2 *)(puVar13 + 9) = *(undefined2 *)(puVar13 + 1);
    }
    if (uVar16 != '\0') {
      (*ssl->handshake->update_checksum)(ssl,ssl->out_msg,sVar21);
    }
  }
  if ((((ssl->conf->field_0x174 & 2) != 0) &&
      (pmVar5 = ssl->handshake, pmVar5 != (mbedtls_ssl_handshake_params *)0x0)) &&
     ((pmVar5->retransmit_state != '\x01' && (uVar4 = ssl->out_msgtype, (uVar4 | 2) == 0x16)))) {
    __ptr = (mbedtls_ssl_flight_item *)calloc(1,0x20);
    iVar11 = -0x7f00;
    if (__ptr == (mbedtls_ssl_flight_item *)0x0) {
LAB_00112778:
      bVar10 = false;
    }
    else {
      local_70 = ssl->out_msglen;
      puVar13 = (uchar *)calloc(1,local_70);
      sVar1 = local_70;
      __ptr->p = puVar13;
      if (puVar13 == (uchar *)0x0) {
        free(__ptr);
        goto LAB_00112778;
      }
      memcpy(puVar13,ssl->out_msg,local_70);
      __ptr->len = sVar1;
      __ptr->type = (uchar)uVar4;
      __ptr->next = (mbedtls_ssl_flight_item *)0x0;
      pmVar6 = pmVar5->flight;
      if (pmVar5->flight == (mbedtls_ssl_flight_item *)0x0) {
        pmVar5->flight = __ptr;
      }
      else {
        do {
          pmVar14 = pmVar6;
          pmVar6 = pmVar14->next;
        } while (pmVar6 != (mbedtls_ssl_flight_item *)0x0);
        pmVar14->next = __ptr;
      }
      iVar11 = 0;
      bVar10 = true;
    }
    if (!bVar10) {
      return iVar11;
    }
  }
  *ssl->out_hdr = (uchar)ssl->out_msgtype;
  iVar11 = ssl->minor_ver;
  puVar13 = ssl->out_hdr;
  uVar16 = (uchar)ssl->major_ver;
  if ((ssl->conf->field_0x174 & 2) == 0) {
    puVar13[1] = uVar16;
    uVar16 = (uchar)iVar11;
  }
  else {
    puVar13[1] = '\x01' - uVar16;
    iVar20 = 1;
    if (iVar11 != 2) {
      iVar20 = iVar11;
    }
    uVar16 = -(char)iVar20;
  }
  puVar13[2] = uVar16;
  *ssl->out_len = (uchar)(sVar21 >> 8);
  ssl->out_len[1] = (uchar)sVar21;
  pmVar7 = ssl->transform_out;
  if (pmVar7 == (mbedtls_ssl_transform *)0x0) goto LAB_00112927;
  if (ssl->session_out == (mbedtls_ssl_session *)0x0) {
LAB_00112904:
    iVar11 = -0x6c00;
  }
  else {
    pmVar8 = (pmVar7->cipher_ctx_enc).cipher_info;
    if (pmVar8 == (mbedtls_cipher_info_t *)0x0) {
      mVar19 = MBEDTLS_MODE_NONE;
    }
    else {
      mVar19 = pmVar8->mode;
    }
    iVar11 = -0x7100;
    if (ssl->out_msglen < 0x4001) {
      if (mVar19 == MBEDTLS_MODE_STREAM) {
LAB_0011283e:
        if (ssl->minor_ver < 1) goto LAB_00112904;
        mbedtls_md_hmac_update(&pmVar7->md_ctx_enc,ssl->out_ctr,8);
        mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_hdr,3);
        mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_len,2);
        mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_msg,ssl->out_msglen);
        mbedtls_md_hmac_finish(&ssl->transform_out->md_ctx_enc,mac);
        mbedtls_md_hmac_reset(&ssl->transform_out->md_ctx_enc);
        memcpy(ssl->out_msg + ssl->out_msglen,mac,ssl->transform_out->maclen);
        ssl->out_msglen = ssl->out_msglen + ssl->transform_out->maclen;
        bVar10 = false;
        iVar20 = 1;
      }
      else {
        bVar10 = true;
        iVar20 = 0;
        if ((mVar19 == MBEDTLS_MODE_CBC) && (iVar20 = 0, ssl->session_out->encrypt_then_mac == 0))
        goto LAB_0011283e;
      }
      if (mVar19 == MBEDTLS_MODE_STREAM) {
        mac[0] = '\0';
        mac[1] = '\0';
        mac[2] = '\0';
        mac[3] = '\0';
        mac[4] = '\0';
        mac[5] = '\0';
        mac[6] = '\0';
        mac[7] = '\0';
        pmVar7 = ssl->transform_out;
        iVar11 = mbedtls_cipher_crypt
                           (&pmVar7->cipher_ctx_enc,pmVar7->iv_enc,pmVar7->ivlen,ssl->out_msg,
                            ssl->out_msglen,ssl->out_msg,(size_t *)mac);
        if (iVar11 == 0) {
          bVar22 = ssl->out_msglen == mac._0_8_;
          iVar11 = -0x6c00;
        }
        else {
          bVar22 = false;
        }
        goto joined_r0x00112c46;
      }
      if (mVar19 == MBEDTLS_MODE_CBC) {
        olen_1 = 0;
        uVar9 = ssl->transform_out->ivlen;
        lVar18 = 0;
        uVar17 = (ssl->out_msglen + 1) % uVar9;
        lVar15 = uVar9 - uVar17;
        if (uVar17 == 0) {
          lVar15 = 0;
        }
        do {
          ssl->out_msg[lVar18 + ssl->out_msglen] = (uchar)lVar15;
          lVar18 = lVar18 + 1;
        } while (lVar15 + 1 + (ulong)(lVar15 + 1 == 0) != lVar18);
        sVar21 = lVar15 + 1 + ssl->out_msglen;
        ssl->out_msglen = sVar21;
        if (ssl->minor_ver < 2) {
          puVar13 = ssl->out_msg;
LAB_00112bee:
          pmVar7 = ssl->transform_out;
          iVar12 = mbedtls_cipher_crypt
                             (&pmVar7->cipher_ctx_enc,pmVar7->iv_enc,pmVar7->ivlen,puVar13,sVar21,
                              puVar13,&olen_1);
          if (iVar12 == 0) {
            if (sVar21 == olen_1) {
              if (ssl->minor_ver < 2) {
                pmVar7 = ssl->transform_out;
                memcpy(pmVar7->iv_enc,(pmVar7->cipher_ctx_enc).iv,pmVar7->ivlen);
              }
              iVar20 = 1;
              bVar22 = true;
              if (bVar10) {
                mac._0_8_ = *(undefined8 *)ssl->out_ctr;
                mac[10] = ssl->out_hdr[2];
                mac._8_2_ = *(undefined2 *)ssl->out_hdr;
                uVar3 = (ushort)ssl->out_msglen;
                mac._11_2_ = uVar3 << 8 | uVar3 >> 8;
                mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,mac,0xd);
                mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_iv,ssl->out_msglen);
                mbedtls_md_hmac_finish
                          (&ssl->transform_out->md_ctx_enc,ssl->out_iv + ssl->out_msglen);
                mbedtls_md_hmac_reset(&ssl->transform_out->md_ctx_enc);
                ssl->out_msglen = ssl->out_msglen + ssl->transform_out->maclen;
              }
              goto joined_r0x00112c46;
            }
            iVar12 = -0x6c00;
          }
        }
        else {
          iVar12 = (*ssl->conf->f_rng)(ssl->conf->p_rng,ssl->transform_out->iv_enc,
                                       ssl->transform_out->ivlen);
          if (iVar12 == 0) {
            memcpy(ssl->out_iv,ssl->transform_out->iv_enc,ssl->transform_out->ivlen);
            puVar13 = ssl->out_msg;
            sVar21 = ssl->out_msglen;
            ssl->out_msglen = ssl->transform_out->ivlen + sVar21;
            goto LAB_00112bee;
          }
        }
        bVar22 = false;
        iVar11 = iVar12;
      }
      else {
        if ((mVar19 != MBEDTLS_MODE_CCM) && (iVar11 = -0x6c00, mVar19 != MBEDTLS_MODE_GCM))
        goto LAB_00112909;
        pmVar7 = ssl->transform_out;
        mac._0_8_ = *(undefined8 *)ssl->out_ctr;
        iVar11 = ssl->minor_ver;
        mac[9] = (uchar)ssl->major_ver;
        if ((ssl->conf->field_0x174 & 2) == 0) {
          mac[10] = (uchar)iVar11;
        }
        else {
          mac[9] = '\x01' - mac[9];
          iVar12 = 1;
          if (iVar11 != 2) {
            iVar12 = iVar11;
          }
          mac[10] = -(char)iVar12;
        }
        mac[8] = (uchar)ssl->out_msgtype;
        uVar3 = (ushort)ssl->out_msglen;
        mac._11_2_ = uVar3 << 8 | uVar3 >> 8;
        if (pmVar7->ivlen - pmVar7->fixed_ivlen == 8) {
          sVar21 = (ulong)((pmVar7->ciphersuite_info->flags & 2) == 0) * 8 + 8;
          *(undefined8 *)(pmVar7->iv_enc + pmVar7->fixed_ivlen) = *(undefined8 *)ssl->out_ctr;
          *(undefined8 *)ssl->out_iv = *(undefined8 *)ssl->out_ctr;
          pmVar7 = ssl->transform_out;
          puVar13 = ssl->out_msg;
          ilen = ssl->out_msglen;
          iv_len = pmVar7->ivlen;
          ssl->out_msglen = (iv_len + ilen) - pmVar7->fixed_ivlen;
          iVar11 = mbedtls_cipher_auth_encrypt
                             (&pmVar7->cipher_ctx_enc,pmVar7->iv_enc,iv_len,mac,0xd,puVar13,ilen,
                              puVar13,&olen_1,puVar13 + ilen,sVar21);
          if (iVar11 == 0) {
            if (olen_1 != ilen) goto LAB_00112c42;
            ssl->out_msglen = ssl->out_msglen + sVar21;
            iVar20 = iVar20 + 1;
            bVar22 = true;
            iVar11 = -0x6c00;
          }
          else {
            bVar22 = false;
          }
        }
        else {
LAB_00112c42:
          bVar22 = false;
          iVar11 = -0x6c00;
        }
      }
joined_r0x00112c46:
      if ((bVar22) && (iVar11 = -0x6c00, iVar20 == 1)) {
        iVar11 = 0;
      }
    }
  }
LAB_00112909:
  if (iVar11 != 0) {
    return iVar11;
  }
  sVar21 = ssl->out_msglen;
  *ssl->out_len = (uchar)(sVar21 >> 8);
  ssl->out_len[1] = (uchar)sVar21;
LAB_00112927:
  ssl->out_left = ssl->out_msglen + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5;
  iVar11 = mbedtls_ssl_flush_output(ssl);
  return iVar11;
}

Assistant:

int mbedtls_ssl_write_record( mbedtls_ssl_context *ssl )
{
    int ret, done = 0, out_msg_type;
    size_t len = ssl->out_msglen;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write record" ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING )
    {
        ; /* Skip special handshake treatment when resending */
    }
    else
#endif
    if( ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        out_msg_type = ssl->out_msg[0];

        if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST &&
            ssl->handshake == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        ssl->out_msg[1] = (unsigned char)( ( len - 4 ) >> 16 );
        ssl->out_msg[2] = (unsigned char)( ( len - 4 ) >>  8 );
        ssl->out_msg[3] = (unsigned char)( ( len - 4 )       );

        /*
         * DTLS has additional fields in the Handshake layer,
         * between the length field and the actual payload:
         *      uint16 message_seq;
         *      uint24 fragment_offset;
         *      uint24 fragment_length;
         */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        {
            /* Make room for the additional DTLS fields */
            if( MBEDTLS_SSL_MAX_CONTENT_LEN - ssl->out_msglen < 8 )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "DTLS handshake message too large: "
                              "size %u, maximum %u",
                               (unsigned) ( ssl->in_hslen - 4 ),
                               (unsigned) ( MBEDTLS_SSL_MAX_CONTENT_LEN - 12 ) ) );
                return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
            }

            memmove( ssl->out_msg + 12, ssl->out_msg + 4, len - 4 );
            ssl->out_msglen += 8;
            len += 8;

            /* Write message_seq and update it, except for HelloRequest */
            if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST )
            {
                ssl->out_msg[4] = ( ssl->handshake->out_msg_seq >> 8 ) & 0xFF;
                ssl->out_msg[5] = ( ssl->handshake->out_msg_seq      ) & 0xFF;
                ++( ssl->handshake->out_msg_seq );
            }
            else
            {
                ssl->out_msg[4] = 0;
                ssl->out_msg[5] = 0;
            }

            /* We don't fragment, so frag_offset = 0 and frag_len = len */
            memset( ssl->out_msg + 6, 0x00, 3 );
            memcpy( ssl->out_msg + 9, ssl->out_msg + 1, 3 );
        }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST )
            ssl->handshake->update_checksum( ssl, ssl->out_msg, len );
    }

    /* Save handshake and CCS messages for resending */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL &&
        ssl->handshake->retransmit_state != MBEDTLS_SSL_RETRANS_SENDING &&
        ( ssl->out_msgtype == MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC ||
          ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE ) )
    {
        if( ( ret = ssl_flight_append( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_flight_append", ret );
            return( ret );
        }
    }
#endif

#if defined(MBEDTLS_ZLIB_SUPPORT)
    if( ssl->transform_out != NULL &&
        ssl->session_out->compression == MBEDTLS_SSL_COMPRESS_DEFLATE )
    {
        if( ( ret = ssl_compress_buf( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_compress_buf", ret );
            return( ret );
        }

        len = ssl->out_msglen;
    }
#endif /*MBEDTLS_ZLIB_SUPPORT */

#if defined(MBEDTLS_SSL_HW_RECORD_ACCEL)
    if( mbedtls_ssl_hw_record_write != NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "going for mbedtls_ssl_hw_record_write()" ) );

        ret = mbedtls_ssl_hw_record_write( ssl );
        if( ret != 0 && ret != MBEDTLS_ERR_SSL_HW_ACCEL_FALLTHROUGH )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_hw_record_write", ret );
            return( MBEDTLS_ERR_SSL_HW_ACCEL_FAILED );
        }

        if( ret == 0 )
            done = 1;
    }
#endif /* MBEDTLS_SSL_HW_RECORD_ACCEL */
    if( !done )
    {
        ssl->out_hdr[0] = (unsigned char) ssl->out_msgtype;
        mbedtls_ssl_write_version( ssl->major_ver, ssl->minor_ver,
                           ssl->conf->transport, ssl->out_hdr + 1 );

        ssl->out_len[0] = (unsigned char)( len >> 8 );
        ssl->out_len[1] = (unsigned char)( len      );

        if( ssl->transform_out != NULL )
        {
            if( ( ret = ssl_encrypt_buf( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_encrypt_buf", ret );
                return( ret );
            }

            len = ssl->out_msglen;
            ssl->out_len[0] = (unsigned char)( len >> 8 );
            ssl->out_len[1] = (unsigned char)( len      );
        }

        ssl->out_left = mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen;

        MBEDTLS_SSL_DEBUG_MSG( 3, ( "output record: msgtype = %d, "
                            "version = [%d:%d], msglen = %d",
                       ssl->out_hdr[0], ssl->out_hdr[1], ssl->out_hdr[2],
                     ( ssl->out_len[0] << 8 ) | ssl->out_len[1] ) );

        MBEDTLS_SSL_DEBUG_BUF( 4, "output record sent to network",
                       ssl->out_hdr, mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen );
    }

    if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_flush_output", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write record" ) );

    return( 0 );
}